

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA3Application.cpp
# Opt level: O0

void PA3Application::resize(GLFWwindow *window,int framebufferWidth,int framebufferHeight)

{
  mat<4,_4,_float,_(glm::qualifier)0> local_a4;
  mat<4,_4,_float,_(glm::qualifier)0> local_64;
  float local_24;
  void *pvStack_20;
  float aspect;
  PA3Application *app;
  int framebufferHeight_local;
  int framebufferWidth_local;
  GLFWwindow *window_local;
  
  app._0_4_ = framebufferHeight;
  app._4_4_ = framebufferWidth;
  _framebufferHeight_local = window;
  pvStack_20 = glfwGetWindowUserPointer(window);
  local_24 = (float)(int)app / (float)app._4_4_;
  if (local_24 <= 1.0) {
    glm::ortho<float>(&local_a4,-1.0 / local_24,1.0 / local_24,-1.0,1.0);
    memcpy((void *)((long)pvStack_20 + 0x30),&local_a4,0x40);
  }
  else {
    glm::ortho<float>(&local_64,-1.0,1.0,-local_24,local_24);
    memcpy((void *)((long)pvStack_20 + 0x30),&local_64,0x40);
  }
  glViewport(0,0,app._4_4_,(int)app);
  return;
}

Assistant:

void PA3Application::resize(GLFWwindow * window, int framebufferWidth, int framebufferHeight)
{
  PA3Application & app = *static_cast<PA3Application *>(glfwGetWindowUserPointer(window));
  float aspect = framebufferHeight / float(framebufferWidth);
  if (aspect > 1) {
    app.m_proj = glm::ortho(-1.f, 1.f, -aspect, aspect);
  } else {
    app.m_proj = glm::ortho(-1 / aspect, 1 / aspect, -1.f, 1.f);
  }
  glViewport(0, 0, framebufferWidth, framebufferHeight);
}